

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

QStringList * __thiscall
QStyleSheetStyleSelector::nodeIds
          (QStringList *__return_storage_ptr__,QStyleSheetStyleSelector *this,NodePtr node)

{
  char cVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = (**(code **)(*(long *)this + 0x38))(this,node.ptr);
  if (cVar1 == '\0') {
    QObject::objectName();
    QList<QString>::QList<QString,void>(__return_storage_ptr__,(QString *)&QStack_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_00356a5a;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
LAB_00356a5a:
      __stack_chk_fail();
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QString *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList nodeIds(NodePtr node) const override
    { return isNullNode(node) ? QStringList() : QStringList(OBJECT_PTR(node)->objectName()); }